

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.c
# Opt level: O2

int h264_dec_ref_base_pic_marking
              (bitstream *str,h264_nal_svc_header *svc,h264_dec_ref_base_pic_marking *ref)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  h264_mmco_entry *phVar4;
  uint32_t *val;
  long lVar5;
  h264_mmco_entry mmco;
  
  iVar3 = vs_u(str,&ref->store_ref_base_pic_flag,1);
  if (iVar3 != 0) {
    return 1;
  }
  if ((svc->use_ref_base_pic_flag != 0) || (ref->store_ref_base_pic_flag != 0)) {
    if (svc->idr_flag != 0) {
      return 0;
    }
    iVar3 = vs_u(str,&ref->adaptive_ref_base_pic_marking_mode_flag,1);
    if (iVar3 != 0) {
      return 1;
    }
    if (ref->adaptive_ref_base_pic_marking_mode_flag == 0) {
      return 0;
    }
    lVar5 = 0;
    do {
      if (str->dir == VS_ENCODE) {
        mmco.max_long_term_frame_idx_plus1 =
             *(uint32_t *)((long)&ref->mmcos->max_long_term_frame_idx_plus1 + lVar5);
        puVar1 = (undefined8 *)((long)&ref->mmcos->memory_management_control_operation + lVar5);
        mmco._0_8_ = *puVar1;
        mmco._8_8_ = puVar1[1];
      }
      iVar3 = vs_ue(str,&mmco.memory_management_control_operation);
      if (iVar3 != 0) {
        return 1;
      }
      if (mmco.memory_management_control_operation != 0) {
        if (mmco.memory_management_control_operation == 2) {
          val = &mmco.long_term_pic_num;
        }
        else {
          val = &mmco.difference_of_pic_nums_minus1;
          if (mmco.memory_management_control_operation != 1) {
            fprintf(_stderr,"Unknown MMCO %d\n");
            return 1;
          }
        }
        iVar3 = vs_ue(str,val);
        if (iVar3 != 0) {
          return 1;
        }
      }
      if (str->dir == VS_DECODE) {
        iVar3 = ref->mmcosnum;
        iVar2 = ref->mmcosmax;
        phVar4 = ref->mmcos;
        if (iVar2 <= iVar3) {
          iVar3 = iVar2 * 2;
          if (iVar2 == 0) {
            iVar3 = 0x10;
          }
          ref->mmcosmax = iVar3;
          phVar4 = (h264_mmco_entry *)realloc(phVar4,(long)iVar3 * 0x14);
          ref->mmcos = phVar4;
          iVar3 = ref->mmcosnum;
        }
        ref->mmcosnum = iVar3 + 1;
        phVar4[iVar3].max_long_term_frame_idx_plus1 = mmco.max_long_term_frame_idx_plus1;
        phVar4 = phVar4 + iVar3;
        phVar4->memory_management_control_operation = mmco.memory_management_control_operation;
        phVar4->difference_of_pic_nums_minus1 = mmco.difference_of_pic_nums_minus1;
        phVar4->long_term_pic_num = mmco.long_term_pic_num;
        phVar4->long_term_frame_idx = mmco.long_term_frame_idx;
      }
      lVar5 = lVar5 + 0x14;
    } while (mmco.memory_management_control_operation != 0);
  }
  return 0;
}

Assistant:

int h264_dec_ref_base_pic_marking(struct bitstream *str, struct h264_nal_svc_header *svc, struct h264_dec_ref_base_pic_marking *ref) {
	if (vs_u(str, &ref->store_ref_base_pic_flag, 1)) return 1;
	if ((svc->use_ref_base_pic_flag || ref->store_ref_base_pic_flag) && !svc->idr_flag) {
		if (vs_u(str, &ref->adaptive_ref_base_pic_marking_mode_flag, 1)) return 1;
		if (ref->adaptive_ref_base_pic_marking_mode_flag) {
			struct h264_mmco_entry mmco;
			int i = 0;
			do {
				if (str->dir == VS_ENCODE)
					mmco = ref->mmcos[i];
				if (vs_ue(str, &mmco.memory_management_control_operation)) return 1;
				switch (mmco.memory_management_control_operation) {
					case H264_MMCO_END:
						break;
					case H264_MMCO_FORGET_SHORT:
						if (vs_ue(str, &mmco.difference_of_pic_nums_minus1)) return 1;
						break;
					case H264_MMCO_FORGET_LONG:
						if (vs_ue(str, &mmco.long_term_pic_num)) return 1;
						break;
					default:
						fprintf (stderr, "Unknown MMCO %d\n", mmco.memory_management_control_operation);
						return 1;
				}
				if (str->dir == VS_DECODE) 
					ADDARRAY(ref->mmcos, mmco);
				i++;
			} while (mmco.memory_management_control_operation != H264_MMCO_END);
		}
	}
	return 0;
}